

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O0

void __thiscall wasm::StringLifting::run::StringApplier::~StringApplier(StringApplier *this)

{
  StringApplier *this_local;
  
  ~StringApplier(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }